

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

void expand_buffer(int length)

{
  int iVar1;
  
  if (buflen <= length) {
    if (buflen == 0) {
      buflen = length + 1;
      buffer = (char *)malloc((long)buflen);
    }
    else {
      iVar1 = buflen * 2;
      buflen = length + 1;
      if (length < iVar1) {
        buflen = iVar1;
      }
      buffer = (char *)realloc(buffer,(long)buflen);
    }
  }
  return;
}

Assistant:

static void expand_buffer(int length) {
  if (length >= buflen) {
    if (!buflen) {
      buflen = length+1;
      buffer = (char*)malloc(buflen);
    } else {
      buflen = 2*buflen;
      if (length >= buflen) buflen = length+1;
      buffer = (char *)realloc((void *)buffer,buflen);
    }
  }
}